

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O3

int Bac_ManAssignCountNames(Bac_Ntk_t *p)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  
  lVar6 = (long)(p->vInputs).nSize;
  if (lVar6 < 1) {
    uVar10 = (p->vType).nSize;
    iVar5 = 0;
    if ((int)uVar10 < 1) {
      return 0;
    }
  }
  else {
    lVar8 = 0;
    iVar5 = 0;
    do {
      iVar3 = (p->vInputs).pArray[lVar8];
      lVar12 = (long)iVar3;
      if ((lVar12 < 0) || (uVar10 = (p->vType).nSize, (int)uVar10 <= iVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      bVar2 = (p->vType).pArray[lVar12];
      if (0xffffffbb < (bVar2 >> 1) - 0x49) {
        __assert_fail("!Bac_ObjIsBox(p, i)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                      ,0x11b,"int Bac_ObjBit(Bac_Ntk_t *, int)");
      }
      if ((char)bVar2 < '\0') {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x130,"int Abc_LitIsCompl(int)");
      }
      if ((bVar2 & 1) == 0) {
        if ((bVar2 & 0x7c) == 4) {
          __assert_fail("!Bac_ObjIsCo(p, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                        ,0x11f,"int Bac_ObjNameInt(Bac_Ntk_t *, int)");
        }
        if ((p->vName).nSize <= iVar3) {
LAB_003b48f9:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar5 = iVar5 + (uint)((p->vName).pArray[lVar12] == 0);
      }
      lVar8 = lVar8 + 1;
    } while (lVar6 != lVar8);
  }
  pcVar4 = (p->vType).pArray;
  uVar7 = (ulong)uVar10;
  uVar9 = 1;
  uVar11 = 0;
  do {
    pbVar1 = (byte *)(pcVar4 + uVar11);
    uVar11 = uVar11 + 1;
    uVar13 = uVar9;
    if (uVar11 < uVar7 && (*pbVar1 >> 1) - 5 < 0x44) {
      do {
        bVar2 = pcVar4[uVar13];
        if ((bVar2 & 0xfe) != 8) break;
        if ((bVar2 & 1) == 0) {
          if ((long)(p->vName).nSize <= (long)uVar13) goto LAB_003b48f9;
          iVar5 = iVar5 + (uint)((p->vName).pArray[uVar13] == 0);
        }
        uVar13 = uVar13 + 1;
      } while (uVar7 != uVar13);
    }
    uVar9 = uVar9 + 1;
    if (uVar11 == uVar7) {
      return iVar5;
    }
  } while( true );
}

Assistant:

int Bac_ManAssignCountNames( Bac_Ntk_t * p )
{
    int i, iObj, iBox, Count = 0;
    Bac_NtkForEachPiMain( p, iObj, i )
        if ( !Bac_ObjNameInt(p, iObj) )
            Count++;
    Bac_NtkForEachBox( p, iBox )
        Bac_BoxForEachBoMain( p, iBox, iObj, i )
            if ( !Bac_ObjNameInt(p, iObj) )
                Count++;
    return Count;
}